

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::anon_unknown_16::UTF16NFDIterator::nextRawCodePoint(UTF16NFDIterator *this)

{
  UChar *pUVar1;
  UChar UVar2;
  UChar UVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  uint uVar6;
  
  pUVar4 = this->s;
  pUVar5 = this->limit;
  uVar6 = 0xffffffff;
  if (pUVar4 != pUVar5) {
    pUVar1 = pUVar4 + 1;
    this->s = pUVar1;
    UVar2 = *pUVar4;
    if (UVar2 == L'\0' && pUVar5 == (UChar *)0x0) {
      this->s = (UChar *)0x0;
    }
    else {
      uVar6 = (uint)(ushort)UVar2;
      if ((pUVar1 != pUVar5 && (uVar6 & 0xfc00) == 0xd800) &&
         (UVar3 = *pUVar1, ((ushort)UVar3 & 0xfc00) == 0xdc00)) {
        this->s = pUVar4 + 2;
        return (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + -0x35fdc00;
      }
    }
  }
  return uVar6;
}

Assistant:

virtual UChar32 nextRawCodePoint() {
        if(s == limit) { return U_SENTINEL; }
        UChar32 c = *s++;
        if(limit == NULL && c == 0) {
            s = NULL;
            return U_SENTINEL;
        }
        UChar trail;
        if(U16_IS_LEAD(c) && s != limit && U16_IS_TRAIL(trail = *s)) {
            ++s;
            c = U16_GET_SUPPLEMENTARY(c, trail);
        }
        return c;
    }